

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  GLFWwindow *pGVar4;
  int value;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  float *pfVar8;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  
  iVar3 = 0;
  do {
    value = iVar3;
    iVar2 = getopt(argc,argv,"bh");
    iVar3 = 1;
  } while (iVar2 == 0x62);
  if (iVar2 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar3 = glfwInit();
    if (iVar3 == 0) goto LAB_00113c5a;
    glfwWindowHint(0x20005,value);
    glfwWindowHint(0x20004,0);
    piVar6 = &titles_rel;
    pfVar8 = &colors[0].b;
    for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
      pGVar4 = glfwCreateWindow(200,200,(char *)((long)&titles_rel + (long)*piVar6),
                                (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      windows[uVar7] = pGVar4;
      if (pGVar4 == (GLFWwindow *)0x0) {
        glfwTerminate();
        goto LAB_00113c5a;
      }
      glfwSetKeyCallback(pGVar4,key_callback);
      glfwMakeContextCurrent(pGVar4);
      gladLoadGLLoader(glfwGetProcAddress);
      (*glad_glClearColor)(((anon_struct_12_3_4e92c811 *)(pfVar8 + -2))->r,pfVar8[-1],*pfVar8,1.0);
      glfwGetWindowFrameSize(pGVar4,&left,&top,&right,&bottom);
      iVar3 = left + right + 300;
      if ((uVar7 & 1) == 0) {
        iVar3 = 100;
      }
      glfwSetWindowPos(pGVar4,iVar3,(bottom + top + 200) * ((uint)(uVar7 >> 1) & 0x7fffffff) + 100);
      piVar6 = piVar6 + 1;
      pfVar8 = pfVar8 + 3;
    }
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      glfwShowWindow(windows[lVar5]);
    }
    bVar1 = true;
    while (bVar1) {
      bVar1 = true;
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        pGVar4 = windows[lVar5];
        glfwMakeContextCurrent(pGVar4);
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(pGVar4);
        iVar3 = glfwWindowShouldClose(pGVar4);
        if (iVar3 != 0) {
          bVar1 = false;
        }
      }
      glfwWaitEvents();
    }
    glfwTerminate();
  }
  else {
    if (iVar2 != 0x68) {
      usage();
LAB_00113c5a:
      exit(1);
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int i, ch;
    int decorated = GLFW_FALSE;
    int running = GLFW_TRUE;
    GLFWwindow* windows[4];

    while ((ch = getopt(argc, argv, "bh")) != -1)
    {
        switch (ch)
        {
            case 'b':
                decorated = GLFW_TRUE;
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_DECORATED, decorated);
    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
        glClearColor(colors[i].r, colors[i].g, colors[i].b, 1.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GLFW_FALSE;
        }

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}